

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnNeutralize
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,string_view building,
          TeamType *oldTeam)

{
  undefined8 uVar1;
  undefined8 uVar2;
  code *pcVar3;
  undefined1 auVar4 [16];
  string msg;
  undefined8 local_50;
  long local_48;
  
  if ((*(uint *)&this->field_0xa0 >> 0x1d & 1) == 0) {
    pcVar3 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar3 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_50,&this->neutralizeFmt);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,player,(PlayerInfo *)0x0,(BuildingInfo *)0x0);
    uVar1 = *(undefined8 *)(RenX::tags + 0x14e8);
    uVar2 = *(undefined8 *)(RenX::tags + 0x14f0);
    auVar4 = RenX::translateName(building._M_len,building._M_str);
    RenX::replace_tag(&local_50,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa08);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa10);
    auVar4 = RenX::getTeamColor(*oldTeam);
    RenX::replace_tag(&local_50,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa28);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa30);
    auVar4 = RenX::getTeamName(*oldTeam);
    RenX::replace_tag(&local_50,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    uVar1 = *(undefined8 *)(RenX::tags + 0xa48);
    uVar2 = *(undefined8 *)(RenX::tags + 0xa50);
    auVar4 = RenX::getFullTeamName(*oldTeam);
    RenX::replace_tag(&local_50,uVar2,uVar1,auVar4._0_8_,auVar4._8_8_);
    (*pcVar3)(server,local_48,local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnNeutralize(RenX::Server &server, const RenX::PlayerInfo &player, std::string_view building, const RenX::TeamType &oldTeam)
{
	logFuncType func;
	if (RenX_LoggingPlugin::neutralizePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->neutralizeFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(building));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(oldTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(oldTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(oldTeam));
		(server.*func)(msg);
	}
}